

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

void duckdb_je_base_stats_get
               (tsdn_t *tsdn,base_t *base,size_t *allocated,size_t *edata_allocated,
               size_t *rtree_allocated,size_t *resident,size_t *mapped,size_t *n_thp)

{
  pthread_mutex_t *__mutex;
  uint64_t *puVar1;
  witness_t **ppwVar2;
  int iVar3;
  
  __mutex = (pthread_mutex_t *)((long)&(base->mtx).field_0 + 0x48);
  iVar3 = pthread_mutex_trylock(__mutex);
  if (iVar3 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&base->mtx);
    (base->mtx).field_0.field_0.locked.repr = true;
  }
  puVar1 = &(base->mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  if ((base->mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
    (base->mtx).field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar2 = &(base->mtx).field_0.witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  *allocated = base->allocated;
  *edata_allocated = base->edata_allocated;
  *rtree_allocated = base->rtree_allocated;
  *resident = base->resident;
  *mapped = base->mapped;
  *n_thp = base->n_thp;
  (base->mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void
base_stats_get(tsdn_t *tsdn, base_t *base, size_t *allocated,
    size_t *edata_allocated, size_t *rtree_allocated, size_t *resident,
    size_t *mapped, size_t *n_thp) {
	cassert(config_stats);

	malloc_mutex_lock(tsdn, &base->mtx);
	assert(base->allocated <= base->resident);
	assert(base->resident <= base->mapped);
	assert(base->edata_allocated + base->rtree_allocated <= base->allocated);
	*allocated = base->allocated;
	*edata_allocated = base->edata_allocated;
	*rtree_allocated = base->rtree_allocated;
	*resident = base->resident;
	*mapped = base->mapped;
	*n_thp = base->n_thp;
	malloc_mutex_unlock(tsdn, &base->mtx);
}